

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O1

bool __thiscall
HACD::RMNode::Raycast
          (RMNode *this,Vec3<double> *from,Vec3<double> *dir,long *triID,Float *distance,
          Vec3<double> *hitPoint,Vec3<double> *hitNormal)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Vec3<long> *pVVar3;
  Vec3<double> *pVVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  bool bVar13;
  bool bVar14;
  SArray<long,_16UL> *pSVar15;
  long lVar16;
  ulong uVar17;
  byte bVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dist;
  Float distToSphere;
  double local_a0;
  undefined8 local_98;
  double *local_90;
  Vec3<double> *local_88;
  long *local_80;
  SArray<long,_16UL> *local_78;
  double local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar13 = BBox::Raycast(&this->m_bBox,from,dir,&local_70);
  if ((bVar13) && (local_70 < *distance)) {
    if (this->m_leaf != true) {
      if (this->m_idRight < 0) {
        bVar13 = false;
      }
      else {
        bVar13 = Raycast(this->m_rm->m_nodes + this->m_idRight,from,dir,triID,distance,hitPoint,
                         hitNormal);
      }
      if (this->m_idLeft < 0) {
        bVar14 = false;
      }
      else {
        bVar14 = Raycast(this->m_rm->m_nodes + this->m_idLeft,from,dir,triID,distance,hitPoint,
                         hitNormal);
      }
      bVar18 = bVar13 | bVar14;
      goto LAB_0085ada6;
    }
    pVVar3 = this->m_rm->m_triangles;
    pVVar4 = this->m_rm->m_vertices;
    local_a0 = 0.0;
    if ((this->m_triIDs).m_size != 0) {
      local_78 = &this->m_triIDs;
      uVar17 = 0;
      local_98 = 0;
      local_90 = distance;
      local_88 = hitPoint;
      local_80 = triID;
      do {
        pSVar15 = local_78;
        if ((this->m_triIDs).m_maxSize != 0x10) {
          pSVar15 = (SArray<long,_16UL> *)(this->m_triIDs).m_data;
        }
        lVar5 = pSVar15->m_data0[uVar17];
        lVar16 = pVVar3[lVar5].m_data[0];
        lVar6 = pVVar3[lVar5].m_data[1];
        lVar7 = pVVar3[lVar5].m_data[2];
        dVar19 = pVVar4[lVar6].m_data[0] - pVVar4[lVar16].m_data[0];
        dVar8 = pVVar4[lVar6].m_data[1] - pVVar4[lVar16].m_data[1];
        dVar9 = pVVar4[lVar6].m_data[2] - pVVar4[lVar16].m_data[2];
        dVar10 = pVVar4[lVar7].m_data[0] - pVVar4[lVar16].m_data[0];
        dVar11 = pVVar4[lVar7].m_data[1] - pVVar4[lVar16].m_data[1];
        dVar12 = pVVar4[lVar7].m_data[2] - pVVar4[lVar16].m_data[2];
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar8;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar12;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar11 * dVar9;
        local_48 = vfmsub231sd_fma(auVar30,auVar23,auVar28);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar10;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar9;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar12 * dVar19;
        local_58 = vfmsub231sd_fma(auVar29,auVar25,auVar27);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar19;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar10 * dVar8;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar11;
        local_68 = vfmsub231sd_fma(auVar24,auVar20,auVar26);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = dir->m_data[0];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_58._0_8_ * dir->m_data[1];
        auVar1 = vfmadd231sd_fma(auVar21,local_48,auVar1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = dir->m_data[2];
        auVar1 = vfmadd231sd_fma(auVar1,local_68,auVar2);
        if (((0.0 < auVar1._0_8_) &&
            (lVar16 = IntersectRayTriangle
                                (from,dir,pVVar4 + lVar16,pVVar4 + lVar6,pVVar4 + lVar7,&local_a0),
            lVar16 == 1)) && (local_a0 < *local_90)) {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = (double)local_58._0_8_ * (double)local_58._0_8_;
          auVar1 = vfmadd231sd_fma(auVar22,local_48,local_48);
          auVar1 = vfmadd231sd_fma(auVar1,local_68,local_68);
          if (auVar1._0_8_ < 0.0) {
            dVar19 = sqrt(auVar1._0_8_);
          }
          else {
            auVar1 = vsqrtsd_avx(auVar1,auVar1);
            dVar19 = auVar1._0_8_;
          }
          bVar13 = dVar19 != 0.0;
          hitNormal->m_data[0] =
               (double)((ulong)bVar13 * (long)((double)local_48._0_8_ / dVar19) +
                       (ulong)!bVar13 * local_48._0_8_);
          hitNormal->m_data[1] =
               (double)((ulong)bVar13 * (long)((double)local_58._0_8_ / dVar19) +
                       (ulong)!bVar13 * local_58._0_8_);
          hitNormal->m_data[2] =
               (double)((ulong)bVar13 * (long)((double)local_68._0_8_ / dVar19) +
                       (ulong)!bVar13 * local_68._0_8_);
          dVar19 = dir->m_data[1];
          dVar8 = dir->m_data[2];
          dVar9 = from->m_data[1];
          dVar10 = from->m_data[2];
          local_88->m_data[0] = local_a0 * dir->m_data[0] + from->m_data[0];
          local_88->m_data[1] = local_a0 * dVar19 + dVar9;
          local_88->m_data[2] = local_a0 * dVar8 + dVar10;
          *local_90 = local_a0;
          *local_80 = lVar5;
          local_98 = CONCAT71((int7)((ulong)local_80 >> 8),1);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (this->m_triIDs).m_size);
      bVar18 = (byte)local_98;
      goto LAB_0085ada6;
    }
  }
  bVar18 = 0;
LAB_0085ada6:
  return (bool)(bVar18 & 1);
}

Assistant:

bool RMNode::Raycast(const Vec3<Float> & from, const Vec3<Float> & dir, long & triID, Float & distance, Vec3<Real> & hitPoint, Vec3<Real> & hitNormal) const 
	{
		Float distToSphere;
		if (m_bBox.Raycast(from, dir, distToSphere) && (distToSphere < distance))
		{
			if (m_leaf)
			{
				long f, i1, j1, k1;
				Vec3<long> * const triangles = m_rm->m_triangles;			
				Vec3<Float> * const vertices = m_rm->m_vertices;
				Vec3<Real> u1, v1, normal1;
				double dist = 0.0;
				long nhit = 0;
				bool ret = false;
				for(size_t id = 0; id < m_triIDs.Size(); ++id)
				{
					f = m_triIDs[id];
					i1 = triangles[f].X();
					j1 = triangles[f].Y();
					k1 = triangles[f].Z();
					u1 = vertices[j1] - vertices[i1];
					v1 = vertices[k1] - vertices[i1];
					normal1 = (u1 ^ v1);
					if (dir * normal1 > 0.0)
					{
						nhit = IntersectRayTriangle(from, dir, vertices[i1], vertices[j1], vertices[k1], dist);
						if (nhit==1 && distance>dist)
						{
							normal1.Normalize();
							hitNormal = normal1;
							hitPoint = from + dist * dir;
							distance = dist;
							triID = f;
							ret = true;
						}						
					}
				}
				return ret;
			}
			bool ret1 = false;
			bool ret2 = false;
			if (m_idRight >= 0) ret1 = m_rm->m_nodes[m_idRight].Raycast(from, dir, triID, distance, hitPoint, hitNormal);
			if (m_idLeft >= 0)  ret2 = m_rm->m_nodes[m_idLeft].Raycast(from, dir, triID, distance, hitPoint, hitNormal);
			return ret1 || ret2;
		}
		return false;
	}